

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalWindow::Deserialize(LogicalWindow *this,Deserializer *deserializer)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  _func_int **pp_Var4;
  tuple<duckdb::LogicalWindow_*,_std::default_delete<duckdb::LogicalWindow>_> this_00;
  pointer pLVar5;
  unique_ptr<duckdb::LogicalWindow,_std::default_delete<duckdb::LogicalWindow>,_true> result;
  __uniq_ptr_impl<duckdb::LogicalWindow,_std::default_delete<duckdb::LogicalWindow>_> local_30;
  _func_int **pp_Var3;
  
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"window_index");
  pp_Var4 = deserializer->_vptr_Deserializer;
  if ((char)uVar1 == '\0') {
    pp_Var3 = (_func_int **)0x0;
  }
  else {
    iVar2 = (*pp_Var4[0x15])(deserializer);
    pp_Var3 = (_func_int **)CONCAT44(extraout_var,iVar2);
    pp_Var4 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var4[5])(deserializer,(ulong)(uVar1 & 0xff));
  this_00.
  super__Tuple_impl<0UL,_duckdb::LogicalWindow_*,_std::default_delete<duckdb::LogicalWindow>_>.
  super__Head_base<0UL,_duckdb::LogicalWindow_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::LogicalWindow_*,_std::default_delete<duckdb::LogicalWindow>_>)
       operator_new(0x70);
  LogicalOperator::LogicalOperator
            ((LogicalOperator *)
             this_00.
             super__Tuple_impl<0UL,_duckdb::LogicalWindow_*,_std::default_delete<duckdb::LogicalWindow>_>
             .super__Head_base<0UL,_duckdb::LogicalWindow_*,_false>._M_head_impl,LOGICAL_WINDOW);
  *(undefined ***)
   this_00.
   super__Tuple_impl<0UL,_duckdb::LogicalWindow_*,_std::default_delete<duckdb::LogicalWindow>_>.
   super__Head_base<0UL,_duckdb::LogicalWindow_*,_false>._M_head_impl =
       &PTR__LogicalOperator_019af0b8;
  ((LogicalOperator *)
  ((long)this_00.
         super__Tuple_impl<0UL,_duckdb::LogicalWindow_*,_std::default_delete<duckdb::LogicalWindow>_>
         .super__Head_base<0UL,_duckdb::LogicalWindow_*,_false>._M_head_impl + 0x68))->
  _vptr_LogicalOperator = pp_Var3;
  local_30._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalWindow_*,_std::default_delete<duckdb::LogicalWindow>_>.
  super__Head_base<0UL,_duckdb::LogicalWindow_*,_false>._M_head_impl =
       (tuple<duckdb::LogicalWindow_*,_std::default_delete<duckdb::LogicalWindow>_>)
       (tuple<duckdb::LogicalWindow_*,_std::default_delete<duckdb::LogicalWindow>_>)
       this_00.
       super__Tuple_impl<0UL,_duckdb::LogicalWindow_*,_std::default_delete<duckdb::LogicalWindow>_>.
       super__Head_base<0UL,_duckdb::LogicalWindow_*,_false>._M_head_impl;
  pLVar5 = unique_ptr<duckdb::LogicalWindow,_std::default_delete<duckdb::LogicalWindow>,_true>::
           operator->((unique_ptr<duckdb::LogicalWindow,_std::default_delete<duckdb::LogicalWindow>,_true>
                       *)&local_30);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            (deserializer,0xc9,"expressions",&(pLVar5->super_LogicalOperator).expressions);
  (this->super_LogicalOperator)._vptr_LogicalOperator =
       (_func_int **)
       local_30._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalWindow_*,_std::default_delete<duckdb::LogicalWindow>_>.
       super__Head_base<0UL,_duckdb::LogicalWindow_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalWindow::Deserialize(Deserializer &deserializer) {
	auto window_index = deserializer.ReadPropertyWithDefault<idx_t>(200, "window_index");
	auto result = duckdb::unique_ptr<LogicalWindow>(new LogicalWindow(window_index));
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<Expression>>>(201, "expressions", result->expressions);
	return std::move(result);
}